

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcSymbol * __thiscall
CTcPrsSymtab::find(CTcPrsSymtab *this,textchar_t *sym,size_t len,CTcPrsSymtab **symtab)

{
  int iVar1;
  undefined4 extraout_var;
  CTcSymbol *unaff_RBX;
  CTcPrsSymtab *curtab;
  CTcSymbol *pCVar2;
  
  do {
    iVar1 = (*this->_vptr_CTcPrsSymtab[2])(this,sym,len);
    pCVar2 = (CTcSymbol *)CONCAT44(extraout_var,iVar1);
    if (pCVar2 != (CTcSymbol *)0x0) {
      unaff_RBX = pCVar2;
    }
    if ((symtab != (CTcPrsSymtab **)0x0) && (pCVar2 != (CTcSymbol *)0x0)) {
      *symtab = this;
      unaff_RBX = pCVar2;
    }
    if (pCVar2 != (CTcSymbol *)0x0) goto LAB_001fba8c;
    this = this->parent_;
  } while (this != (CTcPrsSymtab *)0x0);
  unaff_RBX = (CTcSymbol *)0x0;
LAB_001fba8c:
  if (unaff_RBX != (CTcSymbol *)0x0) {
    (*(unaff_RBX->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry
      [0xf])(unaff_RBX);
  }
  return unaff_RBX;
}

Assistant:

CTcSymbol *CTcPrsSymtab::find(const textchar_t *sym, size_t len,
                              CTcPrsSymtab **symtab)
{
    CTcSymbol *entry;

    /* find the symbol */
    entry = find_noref(sym, len, symtab);

    /* if we found an entry, mark it as referenced */
    if (entry != 0)
        entry->mark_referenced();

    /* return the result */
    return entry;
}